

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

File * __thiscall
NULLCFile::FileCreate
          (File *__return_storage_ptr__,NULLCFile *this,NULLCArray name,NULLCArray access)

{
  FILE *pFVar1;
  undefined4 in_register_0000000c;
  char *__modes;
  
  if (this == (NULLCFile *)0x0) {
    this = (NULLCFile *)0x1f10f0;
  }
  __return_storage_ptr__->flag = 1;
  __modes = "";
  if (CONCAT44(in_register_0000000c,name.len) != 0) {
    __modes = (char *)CONCAT44(in_register_0000000c,name.len);
  }
  pFVar1 = fopen((char *)this,__modes);
  __return_storage_ptr__->handle = (FILE *)pFVar1;
  if (pFVar1 == (FILE *)0x0) {
    __return_storage_ptr__->flag = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

File FileCreate(NULLCArray name, NULLCArray access)
	{
		File ret = { 0, 0 };

		ret.flag = FILE_OPENED;
		ret.handle = fopen(name.ptr ? name.ptr : "", access.ptr ? access.ptr : "");

		if(!ret.handle)
			ret.flag = 0;

		return ret;
	}